

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Bitmask exprSelectTableUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  short sVar1;
  SrcList *pSVar2;
  Bitmask BVar3;
  Bitmask BVar4;
  Bitmask BVar5;
  Bitmask BVar6;
  Bitmask BVar7;
  long lVar8;
  ulong uVar9;
  
  if (pS == (Select *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    do {
      pSVar2 = pS->pSrc;
      BVar3 = exprListTableUsage(pMaskSet,pS->pEList);
      BVar4 = exprListTableUsage(pMaskSet,pS->pGroupBy);
      BVar5 = exprListTableUsage(pMaskSet,pS->pOrderBy);
      BVar6 = exprTableUsage(pMaskSet,pS->pWhere);
      BVar7 = exprTableUsage(pMaskSet,pS->pHaving);
      uVar9 = BVar7 | BVar6 | BVar5 | BVar4 | BVar3 | uVar9;
      if ((pSVar2 != (SrcList *)0x0) && (sVar1 = pSVar2->nSrc, 0 < (long)sVar1)) {
        lVar8 = 0;
        do {
          BVar3 = exprSelectTableUsage(pMaskSet,*(Select **)((long)&pSVar2->a[0].pSelect + lVar8));
          BVar4 = exprTableUsage(pMaskSet,*(Expr **)((long)&pSVar2->a[0].pOn + lVar8));
          uVar9 = BVar3 | uVar9 | BVar4;
          lVar8 = lVar8 + 0x68;
        } while ((long)sVar1 * 0x68 - lVar8 != 0);
      }
      pS = pS->pPrior;
    } while (pS != (Select *)0x0);
  }
  return uVar9;
}

Assistant:

static Bitmask exprSelectTableUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= exprListTableUsage(pMaskSet, pS->pEList);
    mask |= exprListTableUsage(pMaskSet, pS->pGroupBy);
    mask |= exprListTableUsage(pMaskSet, pS->pOrderBy);
    mask |= exprTableUsage(pMaskSet, pS->pWhere);
    mask |= exprTableUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        mask |= exprSelectTableUsage(pMaskSet, pSrc->a[i].pSelect);
        mask |= exprTableUsage(pMaskSet, pSrc->a[i].pOn);
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}